

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

uint32_t __thiscall CNetAddr::GetLinkedIPv4(CNetAddr *this)

{
  long lVar1;
  CNetAddr *pCVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_net == NET_IPV4) {
    if (0x10 < (this->m_addr)._size) {
      this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    }
    uVar4 = *(uint *)&(this->m_addr)._union;
  }
  else {
    bVar3 = IsRFC6052(this);
    if ((bVar3) || (bVar3 = IsRFC6145(this), bVar3)) {
      uVar4 = (this->m_addr)._size;
      uVar5 = uVar4 - 0x11;
      pCVar2 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      if (uVar4 < 0x11) {
        uVar5 = uVar4;
        pCVar2 = this;
      }
      uVar4 = *(uint *)((long)pCVar2 + ((ulong)uVar5 - 4));
    }
    else {
      bVar3 = IsRFC3964(this);
      if (!bVar3) {
        bVar3 = IsRFC4380(this);
        if (!bVar3) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                        ,0x2a3,"uint32_t CNetAddr::GetLinkedIPv4() const");
        }
        uVar4 = (this->m_addr)._size;
        uVar5 = uVar4 - 0x11;
        pCVar2 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
        if (uVar4 < 0x11) {
          uVar5 = uVar4;
          pCVar2 = this;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_006d096d;
        uVar4 = ~*(uint *)((long)pCVar2 + ((ulong)uVar5 - 4));
        goto LAB_006d0918;
      }
      if (0x10 < (this->m_addr)._size) {
        this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      uVar4 = *(uint *)((long)&(this->m_addr)._union + 2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_006d096d:
    __stack_chk_fail();
  }
LAB_006d0918:
  return uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
}

Assistant:

uint32_t CNetAddr::GetLinkedIPv4() const
{
    if (IsIPv4()) {
        return ReadBE32(m_addr.data());
    } else if (IsRFC6052() || IsRFC6145()) {
        // mapped IPv4, SIIT translated IPv4: the IPv4 address is the last 4 bytes of the address
        return ReadBE32(Span{m_addr}.last(ADDR_IPV4_SIZE).data());
    } else if (IsRFC3964()) {
        // 6to4 tunneled IPv4: the IPv4 address is in bytes 2-6
        return ReadBE32(Span{m_addr}.subspan(2, ADDR_IPV4_SIZE).data());
    } else if (IsRFC4380()) {
        // Teredo tunneled IPv4: the IPv4 address is in the last 4 bytes of the address, but bitflipped
        return ~ReadBE32(Span{m_addr}.last(ADDR_IPV4_SIZE).data());
    }
    assert(false);
}